

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O0

char * __thiscall MinVR::VRError::what(VRError *this)

{
  long lVar1;
  char *pcVar2;
  char *__src;
  VRError *in_stack_00000008;
  char *out;
  string emsg;
  string local_50 [32];
  char *local_30;
  string local_28 [40];
  
  _errorMessage_abi_cxx11_(in_stack_00000008);
  lVar1 = std::__cxx11::string::size();
  pcVar2 = (char *)malloc(lVar1 + 2);
  local_30 = pcVar2;
  _errorMessage_abi_cxx11_(in_stack_00000008);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar2,__src);
  std::__cxx11::string::~string(local_50);
  pcVar2 = local_30;
  std::__cxx11::string::~string(local_28);
  return pcVar2;
}

Assistant:

virtual const char* what() const throw (){
    std::string emsg = _errorMessage();
    char* out = (char*)malloc(emsg.size() + 2);
    strcpy(out, _errorMessage().c_str());
    return out;
  }